

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

string * __thiscall
google::protobuf::FieldDescriptor::DefaultValueAsString_abi_cxx11_
          (string *__return_storage_ptr__,FieldDescriptor *this,bool quote_string_type)

{
  FieldDescriptor FVar1;
  string *src;
  long lVar2;
  LogMessage *pLVar3;
  long *plVar4;
  size_type *psVar5;
  FieldDescriptor *pFVar6;
  pointer pcVar7;
  LogMessage *pLVar8;
  char *pcVar9;
  pointer pcVar10;
  undefined1 local_b8 [16];
  long local_a8;
  _Alloc_hider _Stack_a0;
  undefined1 local_80 [32];
  LogMessage local_60;
  
  pLVar8 = (LogMessage *)local_b8;
  pLVar3 = (LogMessage *)this;
  if (((byte)this[1] & 1) == 0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x9fe);
    pLVar3 = internal::LogMessage::operator<<(&local_60,"CHECK failed: has_default_value(): ");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,"No default value");
    internal::LogFinisher::operator=((LogFinisher *)local_b8,pLVar3);
    internal::LogMessage::~LogMessage(&local_60);
  }
  if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
    local_b8._0_8_ = TypeOnceInit;
    local_80._0_8_ = this;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x18),(_func_void_FieldDescriptor_ptr **)local_b8,
               (FieldDescriptor **)local_80);
    pLVar3 = pLVar8;
  }
  switch(*(undefined4 *)(kTypeToCppTypeMap + (ulong)(byte)this[2] * 4)) {
  case 1:
    local_b8._0_8_ = &local_a8;
    local_b8._8_8_ = FastInt32ToBufferLeft(*(int32 *)(this + 0x40),(char *)local_b8._0_8_);
    break;
  case 2:
    local_b8._0_8_ = &local_a8;
    local_b8._8_8_ = FastInt64ToBufferLeft(*(int64 *)(this + 0x40),(char *)local_b8._0_8_);
    break;
  case 3:
    local_b8._0_8_ = &local_a8;
    local_b8._8_8_ = FastUInt32ToBufferLeft(*(uint32 *)(this + 0x40),(char *)local_b8._0_8_);
    break;
  case 4:
    local_b8._0_8_ = &local_a8;
    local_b8._8_8_ = FastUInt64ToBufferLeft(*(uint64 *)(this + 0x40),(char *)local_b8._0_8_);
    break;
  case 5:
    SimpleDtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)pLVar3,*(double *)(this + 0x40));
    return __return_storage_ptr__;
  case 6:
    SimpleFtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)pLVar3,*(float *)(this + 0x40));
    return __return_storage_ptr__;
  case 7:
    FVar1 = this[0x40];
    pcVar9 = "false";
    if ((ulong)(byte)FVar1 != 0) {
      pcVar9 = "true";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pFVar6 = (FieldDescriptor *)pcVar9 + ((ulong)(byte)FVar1 ^ 5);
    goto LAB_0034e8e5;
  case 8:
    if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
      local_b8._0_8_ = this;
      std::
      call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this + 0x18),TypeOnceInit,(FieldDescriptor **)local_b8);
    }
    plVar4 = *(long **)(*(long *)(this + 0x40) + 8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar10 = (pointer)*plVar4;
    pcVar7 = pcVar10 + plVar4[1];
    goto LAB_0034e8b0;
  case 9:
    if (quote_string_type) {
      CEscape((string *)local_80,*(string **)(this + 0x40));
      plVar4 = (long *)std::__cxx11::string::replace((ulong)local_80,0,(char *)0x0,0x3e842c);
      pFVar6 = (FieldDescriptor *)(plVar4 + 2);
      if ((FieldDescriptor *)*plVar4 == pFVar6) {
        local_a8 = *(long *)pFVar6;
        _Stack_a0._M_p = (pointer)plVar4[3];
        local_b8._0_8_ = (FieldDescriptor *)&local_a8;
      }
      else {
        local_a8 = *(long *)pFVar6;
        local_b8._0_8_ = (FieldDescriptor *)*plVar4;
      }
      local_b8._8_8_ = plVar4[1];
      *plVar4 = (long)pFVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append(local_b8);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar5 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar5) {
        lVar2 = plVar4[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      }
      __return_storage_ptr__->_M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((FieldDescriptor *)local_b8._0_8_ != (FieldDescriptor *)&local_a8) {
        operator_delete((void *)local_b8._0_8_);
      }
      if ((FieldDescriptor *)local_80._0_8_ == (FieldDescriptor *)(local_80 + 0x10)) {
        return __return_storage_ptr__;
      }
      operator_delete((void *)local_80._0_8_);
      return __return_storage_ptr__;
    }
    if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
      local_b8._0_8_ = TypeOnceInit;
      local_80._0_8_ = this;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this + 0x18),(_func_void_FieldDescriptor_ptr **)local_b8,
                 (FieldDescriptor **)local_80);
    }
    src = *(string **)(this + 0x40);
    if (this[2] == (FieldDescriptor)0xc) {
      CEscape(__return_storage_ptr__,src);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar10 = (src->_M_dataplus)._M_p;
    pcVar7 = pcVar10 + src->_M_string_length;
LAB_0034e8b0:
    std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar10,pcVar7);
    return __return_storage_ptr__;
  case 10:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_b8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0xa1b);
    pLVar3 = internal::LogMessage::operator<<
                       ((LogMessage *)local_b8,"Messages can\'t have default values!");
    internal::LogFinisher::operator=((LogFinisher *)local_80,pLVar3);
    internal::LogMessage::~LogMessage((LogMessage *)local_b8);
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_b8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0xa1e);
    pLVar3 = internal::LogMessage::operator<<
                       ((LogMessage *)local_b8,
                        "Can\'t get here: failed to get default value as string");
    internal::LogFinisher::operator=((LogFinisher *)local_80,pLVar3);
    internal::LogMessage::~LogMessage((LogMessage *)local_b8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pFVar6 = (FieldDescriptor *)0x3e25d9;
    pcVar9 = "";
    goto LAB_0034e8e5;
  }
  local_b8._8_8_ = local_b8._8_8_ + -(long)&local_a8;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pFVar6 = (FieldDescriptor *)(local_b8._8_8_ + local_b8._0_8_);
  pcVar9 = (char *)local_b8._0_8_;
LAB_0034e8e5:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar9,pFVar6);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldDescriptor::DefaultValueAsString(
    bool quote_string_type) const {
  GOOGLE_CHECK(has_default_value()) << "No default value";
  switch (cpp_type()) {
    case CPPTYPE_INT32:
      return StrCat(default_value_int32_t());
    case CPPTYPE_INT64:
      return StrCat(default_value_int64_t());
    case CPPTYPE_UINT32:
      return StrCat(default_value_uint32_t());
    case CPPTYPE_UINT64:
      return StrCat(default_value_uint64_t());
    case CPPTYPE_FLOAT:
      return SimpleFtoa(default_value_float());
    case CPPTYPE_DOUBLE:
      return SimpleDtoa(default_value_double());
    case CPPTYPE_BOOL:
      return default_value_bool() ? "true" : "false";
    case CPPTYPE_STRING:
      if (quote_string_type) {
        return "\"" + CEscape(default_value_string()) + "\"";
      } else {
        if (type() == TYPE_BYTES) {
          return CEscape(default_value_string());
        } else {
          return default_value_string();
        }
      }
    case CPPTYPE_ENUM:
      return default_value_enum()->name();
    case CPPTYPE_MESSAGE:
      GOOGLE_LOG(DFATAL) << "Messages can't have default values!";
      break;
  }
  GOOGLE_LOG(FATAL) << "Can't get here: failed to get default value as string";
  return "";
}